

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O0

void Fra_FramesAddMore(Aig_Man_t *p,int nFrames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *p1;
  int local_34;
  int nNodesOld;
  int f;
  int k;
  int i;
  Aig_Obj_t **pLatches;
  Aig_Obj_t *pObj;
  int nFrames_local;
  Aig_Man_t *p_local;
  
  for (f = 0; iVar1 = Vec_PtrSize(p->vObjs), f < iVar1; f = f + 1) {
    pvVar4 = Vec_PtrEntry(p->vObjs,f);
    if (pvVar4 != (void *)0x0) {
      *(void **)((long)pvVar4 + 0x28) = pvVar4;
    }
  }
  iVar1 = Aig_ManObjNumMax(p);
  iVar2 = Aig_ManRegNum(p);
  pvVar4 = malloc((long)iVar2 << 3);
  local_34 = 0;
  do {
    if (nFrames <= local_34) {
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
      }
      return;
    }
    iVar2 = Aig_ManCoNum(p);
    iVar3 = Aig_ManRegNum(p);
    for (f = iVar2 - iVar3; iVar2 = Vec_PtrSize(p->vCos), f < iVar2; f = f + 1) {
      pvVar5 = Vec_PtrEntry(p->vCos,f);
      *(undefined8 *)((long)pvVar5 + 0x28) = 0;
    }
    iVar2 = Aig_ManCiNum(p);
    iVar3 = Aig_ManRegNum(p);
    for (f = iVar2 - iVar3; iVar2 = Vec_PtrSize(p->vCis), f < iVar2; f = f + 1) {
      pvVar5 = Vec_PtrEntry(p->vCis,f);
      *(undefined8 *)((long)pvVar5 + 0x28) = 0;
    }
    nNodesOld = 0;
    iVar2 = Aig_ManCoNum(p);
    iVar3 = Aig_ManRegNum(p);
    for (f = iVar2 - iVar3; iVar2 = Vec_PtrSize(p->vCos), f < iVar2; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,f);
      pAVar7 = Aig_ObjFanin0(pAVar6);
      if ((pAVar7->field_5).pData == (void *)0x0) {
        *(undefined8 *)((long)pvVar4 + (long)nNodesOld * 8) = 0;
      }
      else {
        pAVar6 = Aig_ObjChild0Copy(pAVar6);
        *(Aig_Obj_t **)((long)pvVar4 + (long)nNodesOld * 8) = pAVar6;
      }
      nNodesOld = nNodesOld + 1;
    }
    nNodesOld = 0;
    iVar2 = Aig_ManCiNum(p);
    iVar3 = Aig_ManRegNum(p);
    for (f = iVar2 - iVar3; iVar2 = Vec_PtrSize(p->vCis), f < iVar2; f = f + 1) {
      pvVar5 = Vec_PtrEntry(p->vCis,f);
      *(undefined8 *)((long)pvVar5 + 0x28) = *(undefined8 *)((long)pvVar4 + (long)nNodesOld * 8);
      nNodesOld = nNodesOld + 1;
    }
    for (f = 0; iVar2 = Vec_PtrSize(p->vObjs), f < iVar2; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,f);
      if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar6), iVar2 != 0)) {
        if (iVar1 < f) break;
        pAVar7 = Aig_ObjFanin0(pAVar6);
        if (((pAVar7->field_5).pData == (void *)0x0) ||
           (pAVar7 = Aig_ObjFanin1(pAVar6), (pAVar7->field_5).pData == (void *)0x0)) {
          (pAVar6->field_5).pData = (void *)0x0;
        }
        else {
          pAVar7 = Aig_ObjChild0Copy(pAVar6);
          p1 = Aig_ObjChild1Copy(pAVar6);
          pAVar7 = Aig_And(p,pAVar7,p1);
          (pAVar6->field_5).pData = pAVar7;
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Fra_FramesAddMore( Aig_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, ** pLatches;
    int i, k, f, nNodesOld;
    // set copy pointer of each object to point to itself
    Aig_ManForEachObj( p, pObj, i )
        pObj->pData = pObj;
    // iterate and add objects
    nNodesOld = Aig_ManObjNumMax(p);
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p) );
    for ( f = 0; f < nFrames; f++ )
    {
        // clean latch inputs and outputs
        Aig_ManForEachLiSeq( p, pObj, i )
            pObj->pData = NULL;
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pData = NULL;
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p, pObj, i )
        {
            if ( Aig_ObjFanin0(pObj)->pData )
                pLatches[k++] = Aig_ObjChild0Copy(pObj);
            else
                pLatches[k++] = NULL;
        }
        // insert them as the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pData = pLatches[k++];
        // create the next time frame of nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( i > nNodesOld )
                break;
            if ( Aig_ObjFanin0(pObj)->pData && Aig_ObjFanin1(pObj)->pData )
                pObj->pData = Aig_And( p, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else
                pObj->pData = NULL;
        }
    }
    ABC_FREE( pLatches );
}